

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::~BufferAgeTest(BufferAgeTest *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BufferAgeTest_01e0b780;
  deinit(this);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base(&(this->m_evenFrameDrawType).
                   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                 );
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
  ::~_Vector_base(&(this->m_oddFrameDrawType).
                   super__Vector_base<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
                 );
  egl::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BufferAgeTest::~BufferAgeTest (void)
{
	deinit();
}